

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.c
# Opt level: O1

void * pool_buffer_add_move(chck_pool_buffer *pb,void *data,size_t pos,size_t *out_index)

{
  ulong uVar1;
  ulong uVar2;
  uint8_t *__s;
  void *pvVar3;
  
  uVar1 = pb->used;
  if (uVar1 < pos) {
    pos = uVar1;
  }
  __s = (uint8_t *)pool_buffer_add(pb,data,uVar1,(size_t *)0x0);
  if (__s == (uint8_t *)0x0) {
    return (void *)0x0;
  }
  uVar1 = pb->member;
  uVar2 = pb->used;
  if (uVar2 < uVar1) {
    __assert_fail("pb->used >= pb->member",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/pool/pool.c"
                  ,0x89,
                  "void *pool_buffer_add_move(struct chck_pool_buffer *, const void *, size_t, size_t *)"
                 );
  }
  if (pos < uVar2) {
    if (uVar1 < uVar2) {
      memmove(pb->buffer + pos + uVar1,pb->buffer + pos,(uVar2 - pos) - uVar1);
      __s = pb->buffer + pos;
    }
    if (data != (void *)0x0) {
      pvVar3 = memcpy(__s,data,pb->member);
      return pvVar3;
    }
    pvVar3 = memset(__s,0,pb->member);
    return pvVar3;
  }
  __assert_fail("pb->used > pos",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/pool/pool.c",
                0x8a,
                "void *pool_buffer_add_move(struct chck_pool_buffer *, const void *, size_t, size_t *)"
               );
}

Assistant:

static void*
pool_buffer_add_move(struct chck_pool_buffer *pb, const void *data, size_t pos, size_t *out_index)
{
   if (pos > pb->used)
      pos = pb->used;

   void *ptr;
   if (!(ptr = pool_buffer_add(pb, data, pb->used, out_index)))
      return NULL;

   assert(pb->used >= pb->member);
   assert(pb->used > pos);

   if (pb->used > pb->member) {
      const size_t shift = pb->used - (pos + pb->member);
      memmove(pb->buffer + pos + pb->member, pb->buffer + pos, shift);
      ptr = pb->buffer + pos;
   }

   if (data) {
      memcpy(ptr, data, pb->member);
   } else {
      memset(ptr, 0, pb->member);
   }

   return ptr;
}